

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O2

void __thiscall Rml::ElementEffects::ReleaseEffects(ElementEffects *this)

{
  vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
  *this_00;
  pointer pDVar1;
  DecoratorEntry *decorator;
  pointer pDVar2;
  DecoratorEntryList *__range2;
  long lVar3;
  DecoratorEntryList *local_38 [2];
  
  local_38[0] = &this->decorators;
  local_38[1] = &this->mask_images;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 8) {
    this_00 = *(vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                **)((long)local_38 + lVar3);
    pDVar1 = (this_00->
             super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pDVar2 = (this_00->
                  super__Vector_base<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                  )._M_impl.super__Vector_impl_data._M_start; pDVar2 != pDVar1; pDVar2 = pDVar2 + 1)
    {
      if (pDVar2->decorator_data != 0) {
        (*((pDVar2->decorator).super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_vptr_Decorator[3])();
      }
    }
    ::std::
    vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
    ::clear(this_00);
  }
  ::std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
  ::clear(&this->filters);
  ::std::vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
  ::clear(&this->backdrop_filters);
  return;
}

Assistant:

void ElementEffects::ReleaseEffects()
{
	for (DecoratorEntryList* list : {&decorators, &mask_images})
	{
		for (DecoratorEntry& decorator : *list)
		{
			if (decorator.decorator_data)
				decorator.decorator->ReleaseElementData(decorator.decorator_data);
		}
		list->clear();
	}

	filters.clear();
	backdrop_filters.clear();
}